

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderMatrixTests.cpp
# Opt level: O1

void vkt::sr::anon_unknown_0::MatrixCaseUtils::Evaluator<2,_11,_10>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  float *pfVar1;
  long lVar2;
  undefined4 *puVar3;
  long lVar4;
  long lVar5;
  bool bVar6;
  undefined4 uVar7;
  Type in0;
  Type in1;
  undefined8 uStack_b0;
  float local_a4 [3];
  Matrix<float,_2,_4> local_98;
  int local_70 [6];
  Matrix<float,_4,_3> local_58;
  Matrix<float,_2,_3> local_28;
  
  pfVar1 = (float *)&local_98;
  if (in0Type == INPUTTYPE_DYNAMIC) {
    lVar2 = 0;
    do {
      lVar4 = 0;
      do {
        uVar7 = 0x3f800000;
        if (lVar2 != lVar4) {
          uVar7 = 0;
        }
        pfVar1[lVar4 * 2] = (float)uVar7;
        lVar4 = lVar4 + 1;
      } while (lVar4 != 4);
      pfVar1 = pfVar1 + 1;
      bVar6 = lVar2 == 0;
      lVar2 = lVar2 + 1;
    } while (bVar6);
    local_98.m_data.m_data[0].m_data = *(float (*) [2])evalCtx->in[0].m_data;
    local_98.m_data.m_data[1].m_data = *(float (*) [2])evalCtx->in[1].m_data;
    local_98.m_data.m_data[2].m_data = *(float (*) [2])evalCtx->in[2].m_data;
    local_98.m_data.m_data[3].m_data = *(float (*) [2])evalCtx->in[3].m_data;
  }
  else {
    local_98.m_data.m_data[2].m_data[0] = 0.0;
    local_98.m_data.m_data[2].m_data[1] = 0.0;
    local_98.m_data.m_data[3].m_data[0] = 0.0;
    local_98.m_data.m_data[3].m_data[1] = 0.0;
    local_98.m_data.m_data[0].m_data[0] = 0.0;
    local_98.m_data.m_data[0].m_data[1] = 0.0;
    local_98.m_data.m_data[1].m_data[0] = 0.0;
    local_98.m_data.m_data[1].m_data[1] = 0.0;
    puVar3 = &sr::(anonymous_namespace)::s_constInMat4x2;
    lVar2 = 0;
    do {
      lVar4 = 0;
      do {
        pfVar1[lVar4 * 2] = (float)puVar3[lVar4];
        lVar4 = lVar4 + 1;
      } while (lVar4 != 4);
      pfVar1 = pfVar1 + 1;
      puVar3 = puVar3 + 4;
      bVar6 = lVar2 == 0;
      lVar2 = lVar2 + 1;
    } while (bVar6);
  }
  pfVar1 = (float *)&local_58;
  if (in1Type == INPUTTYPE_DYNAMIC) {
    lVar2 = 0;
    lVar4 = 0;
    do {
      lVar5 = 0;
      do {
        uVar7 = 0x3f800000;
        if (lVar2 != lVar5) {
          uVar7 = 0;
        }
        *(undefined4 *)((long)pfVar1 + lVar5) = uVar7;
        lVar5 = lVar5 + 0x10;
      } while (lVar5 != 0x30);
      lVar4 = lVar4 + 1;
      pfVar1 = pfVar1 + 1;
      lVar2 = lVar2 + 0x10;
    } while (lVar4 != 4);
    local_58.m_data.m_data[0].m_data._0_8_ = *(undefined8 *)evalCtx->in[0].m_data;
    local_58.m_data.m_data[0].m_data._8_8_ = *(undefined8 *)(evalCtx->in[0].m_data + 2);
    local_58.m_data.m_data[1].m_data._0_8_ = *(undefined8 *)evalCtx->in[1].m_data;
    local_58.m_data.m_data[1].m_data._8_8_ = *(undefined8 *)(evalCtx->in[1].m_data + 2);
    local_58.m_data.m_data[2].m_data._0_8_ = *(undefined8 *)evalCtx->in[2].m_data;
    local_58.m_data.m_data[2].m_data._8_8_ = *(undefined8 *)(evalCtx->in[2].m_data + 2);
  }
  else {
    local_58.m_data.m_data[2].m_data[0] = 0.0;
    local_58.m_data.m_data[2].m_data[1] = 0.0;
    local_58.m_data.m_data[2].m_data[2] = 0.0;
    local_58.m_data.m_data[2].m_data[3] = 0.0;
    local_58.m_data.m_data[1].m_data[0] = 0.0;
    local_58.m_data.m_data[1].m_data[1] = 0.0;
    local_58.m_data.m_data[1].m_data[2] = 0.0;
    local_58.m_data.m_data[1].m_data[3] = 0.0;
    local_58.m_data.m_data[0].m_data[0] = 0.0;
    local_58.m_data.m_data[0].m_data[1] = 0.0;
    local_58.m_data.m_data[0].m_data[2] = 0.0;
    local_58.m_data.m_data[0].m_data[3] = 0.0;
    puVar3 = &DAT_00b1d4e0;
    lVar2 = 0;
    do {
      lVar4 = 0;
      do {
        pfVar1[lVar4] = *(float *)((long)puVar3 + lVar4);
        lVar4 = lVar4 + 4;
      } while (lVar4 != 0xc);
      lVar2 = lVar2 + 1;
      pfVar1 = pfVar1 + 1;
      puVar3 = puVar3 + 3;
    } while (lVar2 != 4);
  }
  uStack_b0 = 0x5a8608;
  tcu::operator*(&local_28,&local_98,&local_58);
  local_a4[0] = local_28.m_data.m_data[0].m_data[0] + local_28.m_data.m_data[0].m_data[1];
  local_a4[1] = local_28.m_data.m_data[1].m_data[0] + local_28.m_data.m_data[1].m_data[1];
  local_a4[2] = local_28.m_data.m_data[2].m_data[0] + local_28.m_data.m_data[2].m_data[1];
  local_70[2] = 0;
  local_70[3] = 1;
  local_70[4] = 2;
  lVar2 = 2;
  do {
    (evalCtx->color).m_data[local_70[lVar2]] = *(float *)((long)&uStack_b0 + lVar2 * 4 + 4);
    lVar2 = lVar2 + 1;
  } while (lVar2 != 5);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);
		typename TypeTraits<In1DataType>::Type	in1	= (in1Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In1DataType>(evalCtx, 1)
																				     : getInputValue<INPUTTYPE_CONST,	In1DataType>(evalCtx, 1);
		evalCtx.color.xyz() = reduceToVec3(in0 * in1);
	}